

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

void __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::validateBuiltinArgs
          (Interpreter *this,LocationRange *loc,string *name,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args,vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                *params)

{
  ulong uVar1;
  Type TVar2;
  pointer pVVar3;
  Type *pTVar4;
  long lVar5;
  long *plVar6;
  RuntimeError *__return_storage_ptr__;
  pointer pTVar7;
  size_t sVar8;
  ulong uVar9;
  size_type *psVar10;
  Type t;
  Type t_00;
  ulong uVar11;
  pointer pVVar12;
  char *pcVar13;
  bool bVar14;
  stringstream ss;
  string local_200;
  pointer local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  pVVar12 = (args->
            super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pVVar3 = (args->
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  uVar9 = (long)pVVar3 - (long)pVVar12 >> 4;
  pTVar4 = (params->
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (uVar9 == (long)(params->
                     super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar4 >> 2) {
    bVar14 = pVVar3 != pVVar12;
    if (bVar14) {
      if (pVVar12->t == *pTVar4) {
        uVar11 = 0;
        do {
          pVVar12 = pVVar12 + 1;
          if ((uVar9 + (uVar9 == 0)) - 1 == uVar11) {
            return;
          }
          uVar1 = uVar11 + 1;
          lVar5 = uVar11 + 1;
          uVar11 = uVar1;
        } while (pVVar12->t == pTVar4[lVar5]);
        bVar14 = uVar1 < uVar9;
      }
      if (bVar14) goto LAB_001c47db;
    }
    return;
  }
LAB_001c47db:
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::operator+(&local_1d8,"Builtin function ",name);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_1d8);
  local_200._M_dataplus._M_p = (pointer)*plVar6;
  psVar10 = (size_type *)(plVar6 + 2);
  if ((size_type *)local_200._M_dataplus._M_p == psVar10) {
    local_200.field_2._M_allocated_capacity = *psVar10;
    local_200.field_2._8_8_ = plVar6[3];
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  }
  else {
    local_200.field_2._M_allocated_capacity = *psVar10;
  }
  local_200._M_string_length = plVar6[1];
  *plVar6 = (long)psVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,local_200._M_dataplus._M_p,local_200._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  pTVar7 = (params->
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_1e0 = (params->
              super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  if (pTVar7 != local_1e0) {
    pcVar13 = "";
    do {
      TVar2 = *pTVar7;
      sVar8 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar13,sVar8);
      (anonymous_namespace)::type_str_abi_cxx11_(&local_200,(_anonymous_namespace_ *)(ulong)TVar2,t)
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_200._M_dataplus._M_p,local_200._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
      }
      pTVar7 = pTVar7 + 1;
      pcVar13 = ", ";
    } while (pTVar7 != local_1e0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,") but got (",0xb);
  pVVar12 = (args->
            super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pVVar3 = (args->
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pVVar12 != pVVar3) {
    pcVar13 = "";
    do {
      TVar2 = pVVar12->t;
      sVar8 = strlen(pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,pcVar13,sVar8);
      (anonymous_namespace)::type_str_abi_cxx11_
                (&local_200,(_anonymous_namespace_ *)(ulong)TVar2,t_00);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,local_200._M_dataplus._M_p,local_200._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
      }
      pVVar12 = pVVar12 + 1;
      pcVar13 = ", ";
    } while (pVVar12 != pVVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,")",1);
  __return_storage_ptr__ = (RuntimeError *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  Stack::makeError(__return_storage_ptr__,&this->stack,loc,&local_200);
  __cxa_throw(__return_storage_ptr__,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
}

Assistant:

void validateBuiltinArgs(const LocationRange &loc, const std::string &name,
                             const std::vector<Value> &args, const std::vector<Value::Type> params)
    {
        if (args.size() == params.size()) {
            for (std::size_t i = 0; i < args.size(); ++i) {
                if (args[i].t != params[i])
                    goto bad;
            }
            return;
        }
    bad:;
        std::stringstream ss;
        ss << "Builtin function " + name + " expected (";
        const char *prefix = "";
        for (auto p : params) {
            ss << prefix << type_str(p);
            prefix = ", ";
        }
        ss << ") but got (";
        prefix = "";
        for (auto a : args) {
            ss << prefix << type_str(a);
            prefix = ", ";
        }
        ss << ")";
        throw makeError(loc, ss.str());
    }